

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationsInfo.cpp
# Opt level: O3

void __thiscall ezc3d::DataNS::RotationNS::Info::Info(Info *this,c3d *c3d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  PROCESSOR_TYPE PVar4;
  Parameters *pPVar5;
  Group *this_00;
  Parameter *pPVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  Header *this_01;
  ulong uVar9;
  runtime_error *this_02;
  float fVar10;
  string local_88;
  string local_68;
  double local_48;
  undefined8 uStack_40;
  
  this->_hasGroup = false;
  this->_dataStart = 0xffffffffffffffff;
  this->_used = 0;
  this->_ratio = 0;
  pPVar5 = ezc3d::c3d::parameters(c3d);
  paVar1 = &local_88.field_2;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"ROTATION","");
  bVar3 = ParametersNS::Parameters::isGroup(pPVar5,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    return;
  }
  this->_hasGroup = true;
  pPVar5 = ezc3d::c3d::parameters(c3d);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"ROTATION","");
  this_00 = ParametersNS::Parameters::group(pPVar5,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"DATA_START","");
  bVar3 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"DATA_START","");
    pPVar6 = ParametersNS::GroupNS::Group::parameter(this_00,&local_88);
    pvVar7 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar6);
    this->_dataStart =
         (long)*(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"USED","");
    bVar3 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"USED","");
      pPVar6 = ParametersNS::GroupNS::Group::parameter(this_00,&local_88);
      pvVar7 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar6);
      this->_used = (long)*(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"RATIO","");
      bVar3 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_88);
      if (bVar3) {
        bVar3 = false;
      }
      else {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"RATE","");
        bVar3 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        bVar3 = !bVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) {
        local_88._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"RATIO","");
        bVar3 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_88);
        paVar2 = &local_68.field_2;
        local_68._M_dataplus._M_p = (pointer)paVar2;
        if (bVar3) {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"RATIO","");
          pPVar6 = ParametersNS::GroupNS::Group::parameter(this_00,&local_68);
          pvVar7 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar6);
          this->_ratio = (ulong)(uint)*(pvVar7->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_start;
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"RATE","");
          pPVar6 = ParametersNS::GroupNS::Group::parameter(this_00,&local_68);
          pvVar8 = ParametersNS::GroupNS::Parameter::valuesAsDouble(pPVar6);
          local_48 = *(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
          uStack_40 = 0;
          this_01 = ezc3d::c3d::header(c3d);
          fVar10 = Header::frameRate(this_01);
          uVar9 = (ulong)(local_48 / (double)fVar10);
          this->_ratio = (long)(local_48 / (double)fVar10 - 9.223372036854776e+18) &
                         (long)uVar9 >> 0x3f | uVar9;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        pPVar5 = ezc3d::c3d::parameters(c3d);
        PVar4 = ParametersNS::Parameters::processorType(pPVar5);
        this->_processorType = PVar4;
        return;
      }
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"RATIO or RATE must be present in ROTATION.");
    }
    else {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"USED is not present in ROTATION.");
    }
  }
  else {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"DATA_START is not present in ROTATION.");
  }
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ezc3d::DataNS::RotationNS::Info::Info(const ezc3d::c3d &c3d)
    : _hasGroup(false), _dataStart(-1), _used(0), _ratio(0) {
  if (!c3d.parameters().isGroup("ROTATION")) {
    return;
  }
  _hasGroup = true;

  const ezc3d::ParametersNS::GroupNS::Group &group =
      c3d.parameters().group("ROTATION");

  // Do a sanity check before accessing
  if (!group.isParameter("DATA_START")) {
    throw std::runtime_error("DATA_START is not present in ROTATION.");
  }
  _dataStart = group.parameter("DATA_START").valuesAsInt()[0];

  if (!group.isParameter("USED")) {
    throw std::runtime_error("USED is not present in ROTATION.");
  }
  _used = group.parameter("USED").valuesAsInt()[0];

  if (!group.isParameter("RATIO") && !group.isParameter("RATE")) {
    throw std::runtime_error("RATIO or RATE must be present in ROTATION.");
  }
  _ratio = static_cast<size_t>(
      group.isParameter("RATIO") ? group.parameter("RATIO").valuesAsInt()[0]
                                 : group.parameter("RATE").valuesAsDouble()[0] /
                                       c3d.header().frameRate());

  _processorType = c3d.parameters().processorType();
}